

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

void __thiscall iqnet::ssl::Ctx::prepare_verify(Ctx *this,SSL *ssl,bool server)

{
  element_type *peVar1;
  void *data;
  long lVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  uint mode;
  
  peVar1 = (this->impl_).px;
  if ((int)CONCAT71(in_register_00000011,server) == 0) {
    lVar2 = 8;
  }
  else {
    lVar2 = 0x10;
  }
  if (peVar1 == (element_type *)0x0) {
LAB_001689d2:
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->() const [T = iqnet::ssl::Ctx::Impl]"
                 );
  }
  data = *(void **)((long)&peVar1->ctx + lVar2);
  uVar3 = (uint)(data != (void *)0x0);
  mode = uVar3;
  if (server) {
    peVar1 = (this->impl_).px;
    if (peVar1 == (element_type *)0x0) goto LAB_001689d2;
    mode = (data != (void *)0x0) + 2;
    if (peVar1->require_client_cert == false) {
      mode = uVar3;
    }
  }
  if (data == (void *)0x0) {
    SSL_set_verify((SSL *)ssl,mode,(callback *)0x0);
    return;
  }
  SSL_set_verify((SSL *)ssl,mode,anon_unknown_9::iqxmlrpc_SSL_verify);
  SSL_set_ex_data((SSL *)ssl,iqxmlrpc_ssl_data_idx,data);
  return;
}

Assistant:

void
Ctx::prepare_verify(SSL* ssl, bool server)
{
  ConnectionVerifier* v = server ? impl_->client_verifier : impl_->server_verifier;
  int mode = v ? SSL_VERIFY_PEER : SSL_VERIFY_NONE;

  if (server && impl_->require_client_cert)
    mode |= SSL_VERIFY_FAIL_IF_NO_PEER_CERT;

  if (v) {
    SSL_set_verify(ssl, mode, iqxmlrpc_SSL_verify);
    SSL_set_ex_data(ssl, iqxmlrpc_ssl_data_idx, (void*)v);
  } else {
    SSL_set_verify(ssl, mode, 0);
  }
}